

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)11>_> *
vkt::QueryPool::anon_unknown_0::makeQueryPool
          (Move<vk::Handle<(vk::HandleType)11>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkQueryPipelineStatisticFlags statisticFlags)

{
  undefined1 local_48 [8];
  VkQueryPoolCreateInfo queryPoolCreateInfo;
  VkQueryPipelineStatisticFlags statisticFlags_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  local_48._0_4_ = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
  queryPoolCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  queryPoolCreateInfo._4_4_ = 0;
  queryPoolCreateInfo.pNext._0_4_ = 0;
  queryPoolCreateInfo.pNext._4_4_ = 1;
  queryPoolCreateInfo.flags = 1;
  queryPoolCreateInfo.queryType = statisticFlags;
  queryPoolCreateInfo.pipelineStatistics = statisticFlags;
  ::vk::createQueryPool
            (__return_storage_ptr__,vk,device,(VkQueryPoolCreateInfo *)local_48,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkQueryPool> makeQueryPool (const DeviceInterface& vk, const VkDevice device, VkQueryPipelineStatisticFlags statisticFlags)
{
	const VkQueryPoolCreateInfo queryPoolCreateInfo =
	{
		VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO,	// VkStructureType					sType
		DE_NULL,									// const void*						pNext
		(VkQueryPoolCreateFlags)0,					// VkQueryPoolCreateFlags			flags
		VK_QUERY_TYPE_PIPELINE_STATISTICS ,			// VkQueryType						queryType
		1u,											// deUint32							entryCount
		statisticFlags,								// VkQueryPipelineStatisticFlags	pipelineStatistics
	};
	return createQueryPool(vk, device, &queryPoolCreateInfo);
}